

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  short sVar2;
  ushort uVar3;
  u16 uVar4;
  int iVar5;
  Table *pTab;
  sqlite3 *db;
  int *piVar6;
  code *pcVar7;
  Schema *pSVar8;
  sqlite3 *db_00;
  Column *pCVar9;
  LogEst LVar10;
  int iVar11;
  HashElem *pHVar12;
  void *pvVar13;
  Vdbe *pVVar14;
  Parse *pPVar15;
  Table *pTVar16;
  Token *pTVar17;
  size_t sVar18;
  Expr *pExpr;
  ExprList *pList;
  int iVar19;
  uint uVar20;
  Schema **ppSVar21;
  Op *pOVar22;
  u8 *puVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  char *pcVar27;
  short *psVar28;
  char *pcVar29;
  short *psVar30;
  ulong uVar31;
  uint uVar32;
  Index *pIVar33;
  int iVar34;
  Index *unaff_R13;
  int iVar35;
  Op *pOVar36;
  bool bVar37;
  char cVar38;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (pSelect == (Select *)0x0) {
    unaff_R13 = (Index *)pTab->zName;
    pcVar27 = strrchr((char *)unaff_R13,0x5f);
    if (pcVar27 != (char *)0x0) {
      *pcVar27 = '\0';
      pTVar16 = sqlite3FindTable(db,(char *)unaff_R13,(char *)0x0);
      *pcVar27 = '_';
      if ((pTVar16 != (Table *)0x0) && (pTVar16->nModuleArg != 0)) {
        pHVar12 = findElementWithHash(&db->aModule,*pTVar16->azModuleArg,(uint *)0x0);
        if (((undefined8 *)pHVar12->data != (undefined8 *)0x0) &&
           (((piVar6 = *pHVar12->data, 2 < *piVar6 &&
             (pcVar7 = *(code **)(piVar6 + 0x2e), pcVar7 != (code *)0x0)) &&
            (iVar34 = (*pcVar7)(), iVar34 != 0)))) {
          pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
          *pbVar1 = *pbVar1 | 4;
        }
      }
    }
  }
  if ((db->init).busy != '\0') {
    if (pSelect != (Select *)0x0) {
      pcVar27 = "";
      goto LAB_0017077c;
    }
    iVar34 = (db->init).newTnum;
    pTab->tnum = iVar34;
    if (iVar34 == 1) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  if ((tabOpts & 0x20) != 0) {
    uVar20 = pTab->tabFlags;
    if ((uVar20 & 8) != 0) {
      pcVar27 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_0017077c:
      sqlite3ErrorMsg(pParse,pcVar27);
      return;
    }
    if ((uVar20 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = uVar20 | 0x60;
      db_00 = pParse->db;
      pVVar14 = pParse->pVdbe;
      if ((((db_00->init).field_0x6 & 2) == 0) && (sVar2 = pTab->nCol, 0 < (long)sVar2)) {
        pCVar9 = pTab->aCol;
        lVar24 = 0;
        do {
          if (((&pCVar9->colFlags)[lVar24] & 1) != 0) {
            (&pCVar9->notNull)[lVar24] = '\x02';
          }
          lVar24 = lVar24 + 0x20;
        } while ((long)sVar2 * 0x20 != lVar24);
      }
      iVar34 = pParse->addrCrTab;
      if (iVar34 != 0) {
        if (iVar34 < 0) {
          iVar34 = pVVar14->nOp + -1;
        }
        if (pVVar14->db->mallocFailed == '\0') {
          pOVar22 = pVVar14->aOp + iVar34;
        }
        else {
          pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar22->p3 = 2;
      }
      if ((long)pTab->iPKey < 0) {
        for (unaff_R13 = pTab->pIndex;
            (unaff_R13 != (Index *)0x0 && ((*(ushort *)&unaff_R13->field_0x63 & 3) != 2));
            unaff_R13 = unaff_R13->pNext) {
        }
        iVar34 = 1;
        if (1 < unaff_R13->nKeyCol) {
          psVar28 = unaff_R13->aiColumn;
          iVar34 = 1;
          uVar25 = 1;
          do {
            psVar30 = psVar28;
            iVar19 = iVar34;
            do {
              iVar11 = iVar19;
              if (iVar11 < 1) goto LAB_00170a0c;
              sVar2 = *psVar30;
              psVar30 = psVar30 + 1;
              iVar19 = iVar11 + -1;
            } while (sVar2 != psVar28[uVar25]);
            if (iVar11 < 1) {
LAB_00170a0c:
              lVar24 = (long)iVar34;
              iVar34 = iVar34 + 1;
              psVar28[lVar24] = psVar28[uVar25];
            }
            else {
              unaff_R13->nColumn = unaff_R13->nColumn - 1;
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 < unaff_R13->nKeyCol);
        }
        unaff_R13->nKeyCol = (u16)iVar34;
      }
      else {
        dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
        if ((char *)dest._0_8_ == (char *)0x0) {
          uVar20 = 0;
        }
        else {
          sVar18 = strlen((char *)dest._0_8_);
          uVar20 = (uint)sVar18 & 0x3fffffff;
        }
        dest.iSdst = uVar20;
        bVar37 = false;
        pExpr = sqlite3ExprAlloc(db_00,0x3b,(Token *)&dest,0);
        pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
        if (pList != (ExprList *)0x0) {
          pList->a[0].sortOrder = pParse->iPkSortOrder;
          sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                             (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
          if (db_00->mallocFailed == '\0') {
            if (pParse->nErr == 0) {
              for (unaff_R13 = pTab->pIndex;
                  (unaff_R13 != (Index *)0x0 && ((*(ushort *)&unaff_R13->field_0x63 & 3) != 2));
                  unaff_R13 = unaff_R13->pNext) {
              }
              pTab->iPKey = -1;
              bVar37 = true;
            }
            else {
              bVar37 = false;
            }
          }
        }
        if (!bVar37) goto LAB_0017038e;
      }
      uVar3 = *(ushort *)&unaff_R13->field_0x63;
      *(ushort *)&unaff_R13->field_0x63 = uVar3 | 0x20;
      if (((db_00->init).field_0x6 & 2) == 0) {
        *(ushort *)&unaff_R13->field_0x63 = uVar3 | 0x28;
      }
      uVar3 = unaff_R13->nKeyCol;
      uVar25 = (ulong)uVar3;
      if ((pVVar14 != (Vdbe *)0x0) && (0 < (long)unaff_R13->tnum)) {
        if (pVVar14->db->mallocFailed == '\0') {
          pOVar22 = pVVar14->aOp + unaff_R13->tnum;
        }
        else {
          pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar22->opcode = '\v';
      }
      unaff_R13->tnum = pTab->tnum;
      for (pIVar33 = pTab->pIndex; pIVar33 != (Index *)0x0; pIVar33 = pIVar33->pNext) {
        cVar38 = '\n';
        if ((*(ushort *)&pIVar33->field_0x63 & 3) != 2) {
          if (uVar25 == 0) {
            iVar34 = 0;
          }
          else {
            uVar31 = 0;
            iVar34 = 0;
            do {
              psVar28 = pIVar33->aiColumn;
              uVar20 = (uint)pIVar33->nKeyCol;
              do {
                uVar26 = uVar20;
                if ((int)uVar26 < 1) break;
                sVar2 = *psVar28;
                psVar28 = psVar28 + 1;
                uVar20 = uVar26 - 1;
              } while (sVar2 != unaff_R13->aiColumn[uVar31]);
              iVar34 = iVar34 + (uint)((int)uVar26 < 1);
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar25);
          }
          if (iVar34 == 0) {
            pIVar33->nColumn = pIVar33->nKeyCol;
          }
          else {
            iVar34 = resizeIndexObject(db_00,pIVar33,iVar34 + (uint)pIVar33->nKeyCol);
            cVar38 = iVar34 != 0;
            if ((!(bool)cVar38) && (uVar3 != 0)) {
              uVar20 = (uint)pIVar33->nKeyCol;
              uVar31 = 0;
              do {
                psVar28 = pIVar33->aiColumn;
                uVar26 = (uint)pIVar33->nKeyCol;
                do {
                  uVar32 = uVar26;
                  if ((int)uVar32 < 1) goto LAB_00170c12;
                  sVar2 = *psVar28;
                  psVar28 = psVar28 + 1;
                  uVar26 = uVar32 - 1;
                } while (sVar2 != unaff_R13->aiColumn[uVar31]);
                if ((int)uVar32 < 1) {
LAB_00170c12:
                  pIVar33->aiColumn[(int)uVar20] = unaff_R13->aiColumn[uVar31];
                  pIVar33->azColl[(int)uVar20] = unaff_R13->azColl[uVar31];
                  uVar20 = uVar20 + 1;
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar25);
              cVar38 = '\0';
            }
          }
        }
        if ((cVar38 != '\n') && (cVar38 != '\0')) goto LAB_0017038e;
      }
      uVar4 = pTab->nCol;
      if ((int)(uint)uVar3 < (int)(short)uVar4) {
        iVar34 = resizeIndexObject(db_00,unaff_R13,(int)(short)uVar4);
        if (iVar34 != 0) goto LAB_0017038e;
        if (0 < pTab->nCol) {
          iVar34 = 0;
          do {
            iVar19 = (int)uVar25;
            psVar28 = unaff_R13->aiColumn;
            uVar31 = uVar25;
            do {
              iVar11 = (int)uVar31;
              if (iVar11 < 1) goto LAB_00170cb9;
              uVar31 = (ulong)(iVar11 - 1);
              sVar2 = *psVar28;
              psVar28 = psVar28 + 1;
            } while (iVar34 != sVar2);
            if (iVar11 < 1) {
LAB_00170cb9:
              unaff_R13->aiColumn[iVar19] = (short)iVar34;
              unaff_R13->azColl[iVar19] = "BINARY";
              uVar25 = (ulong)(iVar19 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (iVar34 < pTab->nCol);
        }
      }
      else {
        unaff_R13->nColumn = uVar4;
      }
      if ((ulong)unaff_R13->nColumn == 0) {
        uVar25 = 0xffffffffffffffff;
      }
      else {
        lVar24 = (ulong)unaff_R13->nColumn + 1;
        uVar25 = 0;
        do {
          uVar31 = 1L << ((byte)unaff_R13->aiColumn[lVar24 + -2] & 0x3f);
          if (0x3e < (ushort)unaff_R13->aiColumn[lVar24 + -2]) {
            uVar31 = 0;
          }
          uVar25 = uVar25 | uVar31;
          lVar24 = lVar24 + -1;
        } while (1 < lVar24);
        uVar25 = ~uVar25;
      }
      unaff_R13->colNotIdxed = uVar25;
    }
  }
LAB_0017038e:
  if (pTab->pSchema == (Schema *)0x0) {
    iVar34 = -1000000;
  }
  else {
    iVar34 = -1;
    ppSVar21 = &db->aDb->pSchema;
    do {
      iVar34 = iVar34 + 1;
      pSVar8 = *ppSVar21;
      ppSVar21 = ppSVar21 + 4;
    } while (pSVar8 != pTab->pSchema);
  }
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar19 = 0;
  }
  else {
    iVar11 = pTab->nCol + 1;
    puVar23 = &pTab->aCol->szEst;
    iVar19 = 0;
    do {
      iVar19 = iVar19 + (uint)*puVar23;
      iVar11 = iVar11 + -1;
      puVar23 = puVar23 + 0x20;
    } while (1 < iVar11);
  }
  LVar10 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar19) * 4));
  pTab->szTabRow = LVar10;
  for (pIVar33 = pTab->pIndex; pIVar33 != (Index *)0x0; pIVar33 = pIVar33->pNext) {
    estimateIndexWidth(pIVar33);
  }
  if ((db->init).busy == '\0') {
    pVVar14 = sqlite3GetVdbe(pParse);
    if (pVVar14 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar14,0x75,0,0,0);
    bVar37 = pTab->pSelect == (Select *)0x0;
    pcVar27 = "VIEW";
    if (bVar37) {
      pcVar27 = "TABLE";
    }
    pcVar29 = "view";
    if (bVar37) {
      pcVar29 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar17 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar17 = pEnd;
      }
      uVar20 = (int)pTVar17->z - (int)(pParse->sNameToken).z;
      if (*pTVar17->z != ';') {
        uVar20 = uVar20 + pTVar17->n;
      }
      pcVar27 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar27,(ulong)uVar20);
    }
    else {
      iVar19 = pParse->nMem;
      iVar35 = iVar19 + 1;
      iVar11 = iVar19 + 3;
      pParse->nMem = iVar11;
      pPVar15 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar15 = pParse;
      }
      pPVar15->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar14,0x6d,1,pParse->regRoot,iVar34);
      iVar5 = pVVar14->nOp;
      if (0 < (long)iVar5) {
        pVVar14->aOp[(long)iVar5 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar14,0xd,iVar35,0,iVar5 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTVar16 = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTVar16 == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTVar16->nCol;
      pTab->aCol = pTVar16->aCol;
      pTVar16->nCol = 0;
      pTVar16->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTVar16);
      dest.eDest = '\r';
      dest.iSDParm = iVar35;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeAddOp3(pVVar14,0x43,iVar35,0,0);
      pPVar15 = pVVar14->pParse;
      pPVar15->nTempReg = '\0';
      pPVar15->nRangeReg = 0;
      pOVar36 = (Op *)&sqlite3VdbeGetOp_dummy;
      pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar14->db->mallocFailed == '\0') {
        iVar35 = pVVar14->nOp + -1;
        if (-1 < iVar5) {
          iVar35 = iVar5;
        }
        pOVar22 = pVVar14->aOp + iVar35;
      }
      pOVar22->p2 = pVVar14->nOp;
      iVar35 = sqlite3VdbeAddOp3(pVVar14,0xe,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar14,0x5c,dest.iSdst,dest.nSdst,iVar19 + 2);
      sqlite3TableAffinity(pVVar14,pTab,0);
      sqlite3VdbeAddOp3(pVVar14,0x79,1,iVar11,0);
      sqlite3VdbeAddOp3(pVVar14,0x7a,1,iVar19 + 2,iVar11);
      sqlite3VdbeAddOp3(pVVar14,0xb,0,iVar35,0);
      if (pVVar14->db->mallocFailed == '\0') {
        iVar19 = pVVar14->nOp + -1;
        if (-1 < iVar35) {
          iVar19 = iVar35;
        }
        pOVar36 = pVVar14->aOp + iVar19;
      }
      pOVar36->p2 = pVVar14->nOp;
      sqlite3VdbeAddOp3(pVVar14,0x75,1,0,0);
      pcVar27 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar34].zDbSName,"sqlite_master",pcVar29,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar27,(ulong)(uint)pParse->regRowid);
    if (pcVar27 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar27);
    }
    sqlite3ChangeCookie(pParse,iVar34);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar34].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar34].zDbSName
                        );
    }
    pcVar27 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar14,iVar34,pcVar27);
  }
  if ((db->init).busy != '\0') {
    pvVar13 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
    if (pvVar13 == (void *)0x0) {
      pParse->pNewTable = (Table *)0x0;
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
      if (pTab->pSelect == (Select *)0x0) {
        pcVar27 = (pParse->sNameToken).z;
        if (pCons->z != (char *)0x0) {
          pEnd = pCons;
        }
        iVar34 = sqlite3Utf8CharLen(pcVar27,*(int *)&pEnd->z - (int)pcVar27);
        pTab->addColOffset = iVar34 + 0xd;
      }
    }
    else {
      sqlite3OomFault(db);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && isShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}